

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

unsigned_long duckdb::Cast::Operation<short,unsigned_long>(short input)

{
  bool bVar1;
  string *msg;
  unsigned_long result;
  short in_stack_000001ae;
  uint64_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined2 in_stack_ffffffffffffffc4;
  int16_t in_stack_ffffffffffffffc6;
  unsigned_long local_10;
  
  bVar1 = TryCast::Operation<short,unsigned_long>
                    (in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8,false);
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<short,unsigned_long>(in_stack_000001ae);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)
               CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,uVar2)),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return local_10;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}